

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QDockAreaLayoutItem>>
          (QtPrivate *this,QDebug debug,char *which,QList<QDockAreaLayoutItem> *c)

{
  Representation *pRVar1;
  QDockAreaLayoutItem *pQVar2;
  char *pcVar3;
  long lVar4;
  storage_type *psVar5;
  storage_type *psVar6;
  QLayoutItem *this_00;
  QTextStream *pQVar7;
  QDockAreaLayoutItem *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  undefined1 local_78 [24];
  undefined1 local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar7 = *(QTextStream **)debug.stream;
  pQVar7[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar6 = psVar5 + 1;
      pcVar3 = which + 1 + (long)psVar5;
      psVar5 = psVar6;
    } while (*pcVar3 != '\0');
  }
  QVar9.m_data = psVar6;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar7,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar7 = *(QTextStream **)debug.stream;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar7,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar8 = (c->d).ptr;
  lVar4 = (c->d).size;
  pQVar2 = pQVar8 + lVar4;
  if (lVar4 != 0) {
    local_78._16_8_ = *(undefined8 *)debug.stream;
    pRVar1 = &(((QPlaceHolderItem *)local_78._16_8_)->topLevelRect).y2;
    pRVar1->m_i = pRVar1->m_i + 1;
    ::operator<<((Stream *)local_60,(QDockAreaLayoutItem *)(local_78 + 0x10));
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)(local_78 + 0x10));
    pQVar8 = pQVar8 + 1;
  }
  if (pQVar8 != pQVar2) {
    do {
      pQVar7 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar7,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      this_00 = *(QLayoutItem **)debug.stream;
      if (*(char *)&this_00[3]._vptr_QLayoutItem == '\x01') {
        QTextStream::operator<<((QTextStream *)this_00,' ');
        this_00 = *(QLayoutItem **)debug.stream;
      }
      this_00[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i =
           this_00[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
      local_78._0_8_ = this_00;
      ::operator<<((Stream *)(local_78 + 8),(QDockAreaLayoutItem *)local_78);
      QDebug::~QDebug((QDebug *)(local_78 + 8));
      QDebug::~QDebug((QDebug *)local_78);
      pQVar8 = pQVar8 + 1;
    } while (pQVar8 != pQVar2);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar7 = *(QTextStream **)debug.stream;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar7;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}